

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Check_Browser.cxx
# Opt level: O1

int __thiscall Fl_Check_Browser::add(Fl_Check_Browser *this,char *s,int b)

{
  cb_item *pcVar1;
  int iVar2;
  cb_item *pcVar3;
  char *pcVar4;
  cb_item **ppcVar5;
  
  pcVar3 = (cb_item *)malloc(0x20);
  pcVar3->next = (cb_item *)0x0;
  pcVar3->prev = (cb_item *)0x0;
  pcVar3->checked = (char)b;
  pcVar3->selected = '\0';
  pcVar4 = strdup(s);
  pcVar3->text = pcVar4;
  if (b != 0) {
    this->nchecked_ = this->nchecked_ + 1;
  }
  pcVar1 = this->last;
  if (pcVar1 == (cb_item *)0x0) {
    this->last = pcVar3;
    ppcVar5 = &this->first;
  }
  else {
    ppcVar5 = &this->last;
    pcVar1->next = pcVar3;
    pcVar3->prev = pcVar1;
  }
  *ppcVar5 = pcVar3;
  iVar2 = this->nitems_ + 1;
  this->nitems_ = iVar2;
  return iVar2;
}

Assistant:

int Fl_Check_Browser::add(char *s, int b) {
	cb_item *p = (cb_item *)malloc(sizeof(cb_item));
	p->next = 0;
	p->prev = 0;
	p->checked = b;
	p->selected = 0;
	p->text = strdup(s);

	if (b) {
		nchecked_++;
	}

	if (last == 0) {
		first = last = p;
	} else {
		last->next = p;
		p->prev = last;
		last = p;
	}
	nitems_++;

	return (nitems_);
}